

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)((-bit >> 8 & 1) != 0);
  uVar1 = r->d[0];
  r->d[0] = uVar1 + uVar2;
  uVar2 = (ulong)CARRY8(uVar1,uVar2);
  uVar1 = r->d[1];
  r->d[1] = uVar1 + uVar2;
  uVar2 = (ulong)CARRY8(uVar1,uVar2);
  uVar1 = r->d[2];
  r->d[2] = uVar1 + uVar2;
  r->d[3] = r->d[3] + (ulong)CARRY8(uVar1,uVar2);
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    uint128_t t;
    VERIFY_CHECK(bit < 256);
    bit += ((uint32_t) flag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    t = (uint128_t)r->d[0] + (((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[1] + (((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[2] + (((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[3] + (((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL;
#ifdef VERIFY
    VERIFY_CHECK((t >> 64) == 0);
    VERIFY_CHECK(secp256k1_scalar_check_overflow(r) == 0);
#endif
}